

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

void __thiscall
AmstradCPC::CRTCBusHandler::perform_bus_cycle_phase1(CRTCBusHandler *this,BusState *state)

{
  bool bVar1;
  bool bVar2;
  uint8_t *puVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  ushort uVar7;
  byte local_34;
  byte local_33;
  OutputMode local_20;
  uint16_t address;
  OutputMode output_mode;
  bool is_blank;
  bool is_sync;
  bool is_colour_burst;
  bool is_hsync;
  BusState *state_local;
  CRTCBusHandler *this_local;
  
  if ((state->hsync & 1U) == 0) {
    this->cycles_into_hsync_ = 0;
  }
  else {
    this->cycles_into_hsync_ = this->cycles_into_hsync_ + 1;
  }
  bVar1 = false;
  if (1 < this->cycles_into_hsync_) {
    bVar1 = this->cycles_into_hsync_ < 6;
  }
  bVar2 = false;
  if (6 < this->cycles_into_hsync_) {
    bVar2 = this->cycles_into_hsync_ < 0xb;
  }
  local_33 = 1;
  if (!bVar1) {
    local_33 = state->vsync;
  }
  local_34 = 0;
  if ((local_33 & 1) == 0) {
    local_34 = state->hsync;
  }
  if ((local_33 & 1) == 0) {
    if (bVar2) {
      local_20 = ColourBurst;
    }
    else if ((local_34 & 1) == 0) {
      if ((state->display_enable & 1U) == 0) {
        local_20 = Border;
      }
      else {
        local_20 = Pixels;
      }
    }
    else {
      local_20 = Blank;
    }
  }
  else {
    local_20 = Sync;
  }
  if (local_20 != this->previous_output_mode_) {
    if (this->cycles_ != 0) {
      switch(this->previous_output_mode_) {
      case Sync:
        Outputs::CRT::CRT::output_sync(&this->crt_,this->cycles_ << 4);
        break;
      default:
        Outputs::CRT::CRT::output_blank(&this->crt_,this->cycles_ << 4);
        break;
      case ColourBurst:
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,this->cycles_ << 4,')');
        break;
      case Border:
        output_border(this,this->cycles_);
        break;
      case Pixels:
        Outputs::CRT::CRT::output_data
                  (&this->crt_,this->cycles_ << 4,
                   (long)((this->cycles_ << 4) / this->pixel_divider_));
        this->pixel_data_ = (uint8_t *)0x0;
        this->pixel_pointer_ = (uint8_t *)0x0;
      }
    }
    this->cycles_ = 0;
    this->previous_output_mode_ = local_20;
  }
  this->cycles_ = this->cycles_ + 1;
  if (this->previous_output_mode_ == Pixels) {
    if (this->pixel_data_ == (uint8_t *)0x0) {
      puVar3 = Outputs::CRT::CRT::begin_data(&this->crt_,0x140,8);
      this->pixel_data_ = puVar3;
      this->pixel_pointer_ = puVar3;
    }
    if (this->pixel_pointer_ != (uint8_t *)0x0) {
      uVar7 = (state->row_address & 7) * 0x800 + (state->refresh_address & 0x3ff) * 2 +
              (state->refresh_address & 0x3000) * 4;
      switch(this->mode_) {
      case 0:
        pvVar6 = std::array<unsigned_short,_256UL>::operator[]
                           (&this->mode0_output_,(ulong)this->ram_[uVar7]);
        *(value_type_conflict4 *)this->pixel_pointer_ = *pvVar6;
        pvVar6 = std::array<unsigned_short,_256UL>::operator[]
                           (&this->mode0_output_,(ulong)this->ram_[(int)(uVar7 + 1)]);
        *(value_type_conflict4 *)(this->pixel_pointer_ + 2) = *pvVar6;
        this->pixel_pointer_ = this->pixel_pointer_ + 4;
        break;
      case 1:
        pvVar4 = std::array<unsigned_int,_256UL>::operator[]
                           (&this->mode1_output_,(ulong)this->ram_[uVar7]);
        *(value_type_conflict5 *)this->pixel_pointer_ = *pvVar4;
        pvVar4 = std::array<unsigned_int,_256UL>::operator[]
                           (&this->mode1_output_,(ulong)this->ram_[(int)(uVar7 + 1)]);
        *(value_type_conflict5 *)(this->pixel_pointer_ + 4) = *pvVar4;
        this->pixel_pointer_ = this->pixel_pointer_ + 8;
        break;
      case 2:
        pvVar5 = std::array<unsigned_long,_256UL>::operator[]
                           (&this->mode2_output_,(ulong)this->ram_[uVar7]);
        *(value_type_conflict6 *)this->pixel_pointer_ = *pvVar5;
        pvVar5 = std::array<unsigned_long,_256UL>::operator[]
                           (&this->mode2_output_,(ulong)this->ram_[(int)(uVar7 + 1)]);
        *(value_type_conflict6 *)(this->pixel_pointer_ + 8) = *pvVar5;
        this->pixel_pointer_ = this->pixel_pointer_ + 0x10;
        break;
      case 3:
        pvVar6 = std::array<unsigned_short,_256UL>::operator[]
                           (&this->mode3_output_,(ulong)this->ram_[uVar7]);
        *(value_type_conflict4 *)this->pixel_pointer_ = *pvVar6;
        pvVar6 = std::array<unsigned_short,_256UL>::operator[]
                           (&this->mode3_output_,(ulong)this->ram_[(int)(uVar7 + 1)]);
        *(value_type_conflict4 *)(this->pixel_pointer_ + 2) = *pvVar6;
        this->pixel_pointer_ = this->pixel_pointer_ + 4;
      }
      if (this->pixel_pointer_ == this->pixel_data_ + 0x140) {
        Outputs::CRT::CRT::output_data
                  (&this->crt_,this->cycles_ << 4,
                   (long)((this->cycles_ << 4) / this->pixel_divider_));
        this->pixel_data_ = (uint8_t *)0x0;
        this->pixel_pointer_ = (uint8_t *)0x0;
        this->cycles_ = 0;
      }
    }
  }
  return;
}

Assistant:

forceinline void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
			// The gate array waits 2us to react to the CRTC's vsync signal, and then
			// caps output at 4us. Since the clock rate is 1Mhz, that's 2 and 4 cycles,
			// respectively.
			if(state.hsync) {
				cycles_into_hsync_++;
			} else {
				cycles_into_hsync_ = 0;
			}

			const bool is_hsync = (cycles_into_hsync_ >= 2 && cycles_into_hsync_ < 6);
			const bool is_colour_burst = (cycles_into_hsync_ >= 7 && cycles_into_hsync_ < 11);

			// Sync is taken to override pixels, and is combined as a simple OR.
			const bool is_sync = is_hsync || state.vsync;
			const bool is_blank = !is_sync && state.hsync;

			OutputMode output_mode;
			if(is_sync) {
				output_mode = OutputMode::Sync;
			} else if(is_colour_burst) {
				output_mode = OutputMode::ColourBurst;
			} else if(is_blank) {
				output_mode = OutputMode::Blank;
			} else if(state.display_enable) {
				output_mode = OutputMode::Pixels;
			} else {
				output_mode = OutputMode::Border;
			}

			// If a transition between sync/border/pixels just occurred, flush whatever was
			// in progress to the CRT and reset counting.
			if(output_mode != previous_output_mode_) {
				if(cycles_) {
					switch(previous_output_mode_) {
						default:
						case OutputMode::Blank:			crt_.output_blank(cycles_ * 16);				break;
						case OutputMode::Sync:			crt_.output_sync(cycles_ * 16);					break;
						case OutputMode::Border:		output_border(cycles_);							break;
						case OutputMode::ColourBurst:	crt_.output_default_colour_burst(cycles_ * 16);	break;
						case OutputMode::Pixels:
							crt_.output_data(cycles_ * 16, size_t(cycles_ * 16 / pixel_divider_));
							pixel_pointer_ = pixel_data_ = nullptr;
						break;
					}
				}

				cycles_ = 0;
				previous_output_mode_ = output_mode;
			}

			// increment cycles since state changed
			cycles_++;

			// collect some more pixels if output is ongoing
			if(previous_output_mode_ == OutputMode::Pixels) {
				if(!pixel_data_) {
					pixel_pointer_ = pixel_data_ = crt_.begin_data(320, 8);
				}
				if(pixel_pointer_) {
					// the CPC shuffles output lines as:
					//	MA13 MA12	RA2 RA1 RA0		MA9 MA8 MA7 MA6 MA5 MA4 MA3 MA2 MA1 MA0		CCLK
					// ... so form the real access address.
					const uint16_t address =
						uint16_t(
							((state.refresh_address & 0x3ff) << 1) |
							((state.row_address & 0x7) << 11) |
							((state.refresh_address & 0x3000) << 2)
						);

					// Fetch two bytes and translate into pixels. Guaranteed: the mode can change only at
					// hsync, so there's no risk of pixel_pointer_ overrunning 320 output pixels without
					// exactly reaching 320 output pixels.
					switch(mode_) {
						case 0:
							reinterpret_cast<uint16_t *>(pixel_pointer_)[0] = mode0_output_[ram_[address]];
							reinterpret_cast<uint16_t *>(pixel_pointer_)[1] = mode0_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint16_t);
						break;

						case 1:
							reinterpret_cast<uint32_t *>(pixel_pointer_)[0] = mode1_output_[ram_[address]];
							reinterpret_cast<uint32_t *>(pixel_pointer_)[1] = mode1_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint32_t);
						break;

						case 2:
							reinterpret_cast<uint64_t *>(pixel_pointer_)[0] = mode2_output_[ram_[address]];
							reinterpret_cast<uint64_t *>(pixel_pointer_)[1] = mode2_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint64_t);
						break;

						case 3:
							reinterpret_cast<uint16_t *>(pixel_pointer_)[0] = mode3_output_[ram_[address]];
							reinterpret_cast<uint16_t *>(pixel_pointer_)[1] = mode3_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint16_t);
						break;

					}

					// Flush the current buffer pixel if full; the CRTC allows many different display
					// widths so it's not necessarily possible to predict the correct number in advance
					// and using the upper bound could lead to inefficient behaviour.
					if(pixel_pointer_ == pixel_data_ + 320) {
						crt_.output_data(cycles_ * 16, size_t(cycles_ * 16 / pixel_divider_));
						pixel_pointer_ = pixel_data_ = nullptr;
						cycles_ = 0;
					}
				}
			}
		}